

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::doHidePopup(QComboBoxPrivate *this)

{
  bool bVar1;
  
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QComboBoxPrivateContainer> *)0x53bc03);
  if (bVar1) {
    QPointer<QComboBoxPrivateContainer>::operator->((QPointer<QComboBoxPrivateContainer> *)0x53bc1a)
    ;
    bVar1 = QWidget::isVisible((QWidget *)0x53bc22);
    if (bVar1) {
      QPointer<QComboBoxPrivateContainer>::operator->
                ((QPointer<QComboBoxPrivateContainer> *)0x53bc39);
      QWidget::hide((QWidget *)0x53bc41);
    }
  }
  resetButton((QComboBoxPrivate *)0x53bc4b);
  return;
}

Assistant:

void QComboBoxPrivate::doHidePopup()
{
    if (container && container->isVisible())
        container->hide();

    resetButton();
}